

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.cpp
# Opt level: O2

void crnlib::utils::endian_switch_words(uint16 *p,uint num)

{
  ushort *puVar1;
  long lVar2;
  
  for (lVar2 = 0; (ulong)num * 2 != lVar2; lVar2 = lVar2 + 2) {
    puVar1 = (ushort *)((long)p + lVar2);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  }
  return;
}

Assistant:

void endian_switch_words(uint16* p, uint num)
        {
            uint16* p_end = p + num;
            while (p != p_end)
            {
                uint16 k = *p;
                *p++ = swap16(k);
            }
        }